

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1536.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 uVar8;
  undefined8 uStack_40;
  char *scheme;
  
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 != 0) {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1536.c"
                  ,0x22,iVar1,uVar3);
    return iVar1;
  }
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    lVar5 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1536.c"
                  ,0x24);
    iVar1 = 0x7c;
    goto LAB_00101357;
  }
  iVar1 = curl_easy_getinfo(lVar4,0x100031,&scheme);
  uVar8 = _stderr;
  if (iVar1 == 0) {
    if (scheme != (char *)0x0) {
      pcVar6 = "%s:%d scheme init failed; expected NULL\n";
      lVar5 = 0;
      uStack_40 = 0x31;
      goto LAB_0010134c;
    }
    iVar1 = curl_easy_setopt(lVar4,0x2712,URL);
    uVar8 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_perform(lVar4);
      uVar8 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_getinfo(lVar4,0x100031,&scheme);
        pcVar6 = scheme;
        uVar8 = _stderr;
        if (iVar1 == 0) {
          iVar1 = bcmp(scheme,"HTTP",5);
          if (iVar1 != 0) {
            pcVar7 = "invalid";
            if (pcVar6 == (char *)0x0) {
              pcVar7 = "NULL";
            }
            lVar5 = 0;
            curl_mfprintf(_stderr,
                          "%s:%d scheme of http resource is incorrect; expected \'HTTP\' but is %s\n"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1536.c"
                          ,0x4b,pcVar7);
            iVar1 = 0x16;
            goto LAB_00101357;
          }
          lVar5 = curl_easy_duphandle(lVar4);
          if (lVar5 == 0) {
            pcVar6 = "%s:%d curl_easy_duphandle() failed\n";
            lVar5 = 0;
            uStack_40 = 0x57;
          }
          else {
            iVar1 = curl_easy_getinfo(lVar5,0x100031,&scheme);
            uVar8 = _stderr;
            if (iVar1 != 0) {
              uVar3 = curl_easy_strerror(iVar1);
              pcVar6 = "%s:%d curl_easy_getinfo() failed with code %d (%s)\n";
              uStack_40 = 0x5f;
              goto LAB_001012eb;
            }
            if (scheme == (char *)0x0) {
              curl_easy_reset(lVar4);
              iVar1 = 0;
              iVar2 = curl_easy_getinfo(lVar4,0x100031,&scheme);
              uVar8 = _stderr;
              if (iVar2 != 0) {
                uVar3 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar8,"%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1536.c"
                              ,0x72,iVar2,uVar3);
                iVar1 = iVar2;
                goto LAB_00101357;
              }
              if (scheme == (char *)0x0) goto LAB_00101357;
              pcVar6 = "%s:%d scheme init failed; expected NULL\n";
              uStack_40 = 0x77;
            }
            else {
              pcVar6 = "%s:%d scheme init failed; expected NULL\n";
              uStack_40 = 100;
            }
          }
LAB_0010134c:
          curl_mfprintf(_stderr,pcVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1536.c"
                        ,uStack_40);
          iVar1 = 2;
          goto LAB_00101357;
        }
        uVar3 = curl_easy_strerror(iVar1);
        pcVar6 = "%s:%d curl_easy_getinfo() failed with code %d (%s)\n";
        lVar5 = 0;
        uStack_40 = 0x45;
      }
      else {
        uVar3 = curl_easy_strerror(iVar1);
        pcVar6 = "%s:%d curl_easy_perform() failed with code %d (%s)\n";
        lVar5 = 0;
        uStack_40 = 0x3b;
      }
    }
    else {
      uVar3 = curl_easy_strerror(iVar1);
      pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar5 = 0;
      uStack_40 = 0x36;
    }
  }
  else {
    uVar3 = curl_easy_strerror(iVar1);
    pcVar6 = "%s:%d curl_easy_getinfo() failed with code %d (%s)\n";
    lVar5 = 0;
    uStack_40 = 0x2c;
  }
LAB_001012eb:
  curl_mfprintf(uVar8,pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1536.c"
                ,uStack_40,iVar1,uVar3);
LAB_00101357:
  curl_easy_cleanup(lVar4);
  curl_easy_cleanup(lVar5);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curl, *dupe = NULL;
  char *scheme;
  int res = CURLE_OK;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  /* Test that scheme is properly initialized on curl_easy_init.
  */

  res = curl_easy_getinfo(curl, CURLINFO_SCHEME, &scheme);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(scheme != NULL) {
    fprintf(stderr, "%s:%d scheme init failed; expected NULL\n",
            __FILE__, __LINE__);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

  easy_setopt(curl, CURLOPT_URL, URL);

  res = curl_easy_perform(curl);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_perform() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }

  /* Test that a scheme is properly set after receiving an HTTP resource.
  */

  res = curl_easy_getinfo(curl, CURLINFO_SCHEME, &scheme);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(memcmp(scheme, "HTTP", 5) != 0) {
    fprintf(stderr, "%s:%d scheme of http resource is incorrect; "
            "expected 'HTTP' but is %s\n",
            __FILE__, __LINE__,
            (scheme == NULL ? "NULL" : "invalid"));
    res = CURLE_HTTP_RETURNED_ERROR;
    goto test_cleanup;
  }

  /* Test that a scheme is properly initialized on curl_easy_duphandle.
  */

  dupe = curl_easy_duphandle(curl);
  if(!dupe) {
    fprintf(stderr, "%s:%d curl_easy_duphandle() failed\n",
            __FILE__, __LINE__);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

  res = curl_easy_getinfo(dupe, CURLINFO_SCHEME, &scheme);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(scheme != 0) {
    fprintf(stderr, "%s:%d scheme init failed; expected NULL\n",
            __FILE__, __LINE__);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }


  /* Test that a scheme is properly initialized on curl_easy_reset.
  */

  curl_easy_reset(curl);

  res = curl_easy_getinfo(curl, CURLINFO_SCHEME, &scheme);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(scheme != 0) {
    fprintf(stderr, "%s:%d scheme init failed; expected NULL\n",
            __FILE__, __LINE__);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

test_cleanup:
  curl_easy_cleanup(curl);
  curl_easy_cleanup(dupe);
  curl_global_cleanup();
  return res;
}